

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_symbolEncodingTypeStats_t *
ZSTD_buildSequencesStatistics
          (ZSTD_symbolEncodingTypeStats_t *__return_storage_ptr__,seqStore_t *seqStorePtr,
          size_t nbSeq,ZSTD_fseCTables_t *prevEntropy,ZSTD_fseCTables_t *nextEntropy,BYTE *dst,
          BYTE *dstEnd,ZSTD_strategy strategy,uint *countWorkspace,void *entropyWorkspace,
          size_t entropyWkspSize)

{
  BYTE *pBVar1;
  FSE_CTable *pFVar2;
  ZSTD_fseCTables_t *pZVar3;
  ZSTD_fseCTables_t *prevCTable;
  symbolEncodingType_e sVar4;
  size_t sVar5;
  FSE_CTable *prevCTable_00;
  BYTE *local_80;
  uint max;
  FSE_CTable *local_70;
  FSE_CTable *local_68;
  BYTE *local_60;
  ZSTD_symbolEncodingTypeStats_t *local_58;
  ZSTD_fseCTables_t *local_50;
  ZSTD_fseCTables_t *local_48;
  BYTE *local_40;
  uint max_2;
  uint max_1;
  
  local_68 = (FSE_CTable *)seqStorePtr->ofCode;
  pBVar1 = seqStorePtr->llCode;
  local_40 = seqStorePtr->mlCode;
  __return_storage_ptr__->lastCountSize = 0;
  local_70 = nextEntropy->litlengthCTable;
  local_60 = dst;
  ZSTD_seqToCodes(seqStorePtr);
  max = 0x23;
  sVar5 = HIST_countFast_wksp(countWorkspace,&max,pBVar1,nbSeq,entropyWorkspace,entropyWkspSize);
  nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
  local_50 = nextEntropy;
  local_48 = prevEntropy;
  sVar4 = ZSTD_selectEncodingType
                    (&nextEntropy->litlength_repeatMode,countWorkspace,max,sVar5,nbSeq,9,
                     prevEntropy->litlengthCTable,LL_defaultNorm,6,ZSTD_defaultAllowed,strategy);
  local_80 = local_60;
  pFVar2 = local_70;
  __return_storage_ptr__->LLtype = sVar4;
  local_70 = (FSE_CTable *)nbSeq;
  sVar5 = ZSTD_buildCTable(local_60,(long)dstEnd - (long)local_60,pFVar2,9,sVar4,countWorkspace,max,
                           pBVar1,nbSeq,LL_defaultNorm,6,0x23,prevEntropy->litlengthCTable,0x524,
                           entropyWorkspace,entropyWkspSize);
  pFVar2 = local_70;
  if (sVar5 < 0xffffffffffffff89) {
    if (sVar4 == set_compressed) {
      __return_storage_ptr__->lastCountSize = sVar5;
    }
    local_80 = local_80 + sVar5;
  }
  else {
    __return_storage_ptr__->size = sVar5;
  }
  if (sVar5 < 0xffffffffffffff89) {
    max_1 = 0x1f;
    sVar5 = HIST_countFast_wksp(countWorkspace,&max_1,local_68,(size_t)local_70,entropyWorkspace,
                                entropyWkspSize);
    prevCTable = local_48;
    pZVar3 = local_50;
    local_50->offcode_repeatMode = local_48->offcode_repeatMode;
    sVar4 = ZSTD_selectEncodingType
                      (&local_50->offcode_repeatMode,countWorkspace,max_1,sVar5,(size_t)pFVar2,8,
                       local_48->offcodeCTable,OF_defaultNorm,5,(uint)(max_1 < 0x1d),strategy);
    __return_storage_ptr__->Offtype = sVar4;
    local_58 = __return_storage_ptr__;
    sVar5 = ZSTD_buildCTable(local_80,(long)dstEnd - (long)local_80,pZVar3->offcodeCTable,8,sVar4,
                             countWorkspace,max_1,(BYTE *)local_68,(size_t)pFVar2,OF_defaultNorm,5,
                             0x1c,prevCTable->offcodeCTable,0x304,entropyWorkspace,entropyWkspSize);
    pBVar1 = local_40;
    pZVar3 = local_50;
    __return_storage_ptr__ = local_58;
    pFVar2 = local_70;
    if (sVar5 < 0xffffffffffffff89) {
      if (sVar4 == set_compressed) {
        local_58->lastCountSize = sVar5;
      }
      local_80 = local_80 + sVar5;
    }
    else {
      local_58->size = sVar5;
    }
    if (sVar5 < 0xffffffffffffff89) {
      local_68 = local_50->matchlengthCTable;
      max_2 = 0x34;
      sVar5 = HIST_countFast_wksp(countWorkspace,&max_2,local_40,(size_t)local_70,entropyWorkspace,
                                  entropyWkspSize);
      pZVar3->matchlength_repeatMode = local_48->matchlength_repeatMode;
      prevCTable_00 = local_48->matchlengthCTable;
      sVar4 = ZSTD_selectEncodingType
                        (&pZVar3->matchlength_repeatMode,countWorkspace,max_2,sVar5,(size_t)pFVar2,9
                         ,prevCTable_00,ML_defaultNorm,6,ZSTD_defaultAllowed,strategy);
      __return_storage_ptr__->MLtype = sVar4;
      sVar5 = ZSTD_buildCTable(local_80,(long)dstEnd - (long)local_80,local_68,9,sVar4,
                               countWorkspace,max_2,pBVar1,(size_t)pFVar2,ML_defaultNorm,6,0x34,
                               prevCTable_00,0x5ac,entropyWorkspace,entropyWkspSize);
      if (sVar5 < 0xffffffffffffff89) {
        if (__return_storage_ptr__->MLtype == 2) {
          __return_storage_ptr__->lastCountSize = sVar5;
        }
        local_80 = local_80 + sVar5;
      }
      else {
        __return_storage_ptr__->size = sVar5;
      }
      if (sVar5 < 0xffffffffffffff89) {
        __return_storage_ptr__->size = (long)local_80 - (long)local_60;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_symbolEncodingTypeStats_t
ZSTD_buildSequencesStatistics(seqStore_t* seqStorePtr, size_t nbSeq,
                        const ZSTD_fseCTables_t* prevEntropy, ZSTD_fseCTables_t* nextEntropy,
                              BYTE* dst, const BYTE* const dstEnd,
                              ZSTD_strategy strategy, unsigned* countWorkspace,
                              void* entropyWorkspace, size_t entropyWkspSize) {
    BYTE* const ostart = dst;
    const BYTE* const oend = dstEnd;
    BYTE* op = ostart;
    FSE_CTable* CTable_LitLength = nextEntropy->litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->matchlengthCTable;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    ZSTD_symbolEncodingTypeStats_t stats;

    stats.lastCountSize = 0;
    /* convert length/distances into codes */
    ZSTD_seqToCodes(seqStorePtr);
    assert(op <= oend);
    assert(nbSeq != 0); /* ZSTD_selectEncodingType() divides by nbSeq */
    /* build CTable for Literal Lengths */
    {   unsigned max = MaxLL;
        size_t const mostFrequent = HIST_countFast_wksp(countWorkspace, &max, llCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building LL table");
        nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
        stats.LLtype = ZSTD_selectEncodingType(&nextEntropy->litlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        LLFSELog, prevEntropy->litlengthCTable,
                                        LL_defaultNorm, LL_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(set_basic < set_compressed && set_rle < set_compressed);
        assert(!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_LitLength, LLFSELog, (symbolEncodingType_e)stats.LLtype,
                countWorkspace, max, llCodeTable, nbSeq,
                LL_defaultNorm, LL_defaultNormLog, MaxLL,
                prevEntropy->litlengthCTable,
                sizeof(prevEntropy->litlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for LitLens failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.LLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for Offsets */
    {   unsigned max = MaxOff;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, ofCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);  /* can't fail */
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
        stats.Offtype = ZSTD_selectEncodingType(&nextEntropy->offcode_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        OffFSELog, prevEntropy->offcodeCTable,
                                        OF_defaultNorm, OF_defaultNormLog,
                                        defaultPolicy, strategy);
        assert(!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)stats.Offtype,
                countWorkspace, max, ofCodeTable, nbSeq,
                OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                prevEntropy->offcodeCTable,
                sizeof(prevEntropy->offcodeCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for Offsets failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.Offtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for MatchLengths */
    {   unsigned max = MaxML;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, mlCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building ML table (remaining space : %i)", (int)(oend-op));
        nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
        stats.MLtype = ZSTD_selectEncodingType(&nextEntropy->matchlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        MLFSELog, prevEntropy->matchlengthCTable,
                                        ML_defaultNorm, ML_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_MatchLength, MLFSELog, (symbolEncodingType_e)stats.MLtype,
                countWorkspace, max, mlCodeTable, nbSeq,
                ML_defaultNorm, ML_defaultNormLog, MaxML,
                prevEntropy->matchlengthCTable,
                sizeof(prevEntropy->matchlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for MatchLengths failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.MLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    stats.size = (size_t)(op-ostart);
    return stats;
}